

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O1

void __thiscall
FactoredDecPOMDPDiscrete::~FactoredDecPOMDPDiscrete(FactoredDecPOMDPDiscrete *this,void **vtt)

{
  void *pvVar1;
  pointer puVar2;
  pointer ppRVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  pvVar1 = *vtt;
  *(void **)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
             super_MultiAgentDecisionProcess = pvVar1;
  *(void **)(&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
              super_MultiAgentDecisionProcess.field_0x0 + *(long *)((long)pvVar1 + -0x58)) =
       vtt[0xb];
  *(void **)(&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
              super_MultiAgentDecisionProcess.field_0x0 +
            *(long *)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                super_MultiAgentDecisionProcess + -0x60)) = vtt[0xc];
  *(void **)(&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
              super_MultiAgentDecisionProcess.field_0x0 +
            *(long *)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                super_MultiAgentDecisionProcess + -0x68)) = vtt[0xd];
  *(void **)(&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
              super_MultiAgentDecisionProcess.field_0x0 +
            *(long *)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                super_MultiAgentDecisionProcess + -0x70)) = vtt[0xe];
  *(void **)(&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
              super_MultiAgentDecisionProcess.field_0x0 +
            *(long *)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                super_MultiAgentDecisionProcess + -0x40)) = vtt[0xf];
  *(void **)(&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
              super_MultiAgentDecisionProcess.field_0x0 +
            *(long *)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                super_MultiAgentDecisionProcess + -0x50)) = vtt[0x10];
  *(void **)(&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
              super_MultiAgentDecisionProcess.field_0x0 +
            *(long *)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                super_MultiAgentDecisionProcess + -0x48)) = vtt[0x11];
  *(void **)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).field_0x600 = vtt[0x12];
  ppRVar3 = (this->_m_LRFs).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->_m_LRFs).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar3;
  if (lVar4 != 0) {
    uVar5 = lVar4 >> 3;
    uVar6 = 1;
    uVar7 = 0;
    do {
      if (uVar5 <= uVar7) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      if (ppRVar3[uVar7] != (RewardModel *)0x0) {
        (*(ppRVar3[uVar7]->super_RewardModelDiscreteInterface).super_QTableInterface.
          _vptr_QTableInterface[3])();
      }
      uVar7 = (ulong)uVar6;
      ppRVar3 = (this->_m_LRFs).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar5 = (long)(this->_m_LRFs).
                    super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppRVar3 >> 3;
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar7);
  }
  if (this->_m_p_rModel != (RewardModel *)0x0) {
    (*(this->_m_p_rModel->super_RewardModelDiscreteInterface).super_QTableInterface.
      _vptr_QTableInterface[3])();
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&this->_m_nrActionVals);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&this->_m_nrSFVals);
  puVar2 = (this->_m_nrAIs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->_m_nrAIs).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  puVar2 = (this->_m_nrXIs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->_m_nrXIs).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&(this->_m_immRewScope)._m_sfacScopes);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&(this->_m_immRewScope)._m_agentScopes);
  ppRVar3 = (this->_m_LRFs).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppRVar3 != (pointer)0x0) {
    operator_delete(ppRVar3,(long)(this->_m_LRFs).
                                  super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppRVar3)
    ;
  }
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&this->_m_agScopes);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&this->_m_sfScopes);
  MultiAgentDecisionProcessDiscreteFactoredStates::~MultiAgentDecisionProcessDiscreteFactoredStates
            (&this->super_MultiAgentDecisionProcessDiscreteFactoredStates,vtt + 1);
  return;
}

Assistant:

FactoredDecPOMDPDiscrete::~FactoredDecPOMDPDiscrete()
{
    for(Index i=0;i!=_m_LRFs.size();++i)
        delete _m_LRFs.at(i);
    delete _m_p_rModel;
}